

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

double __thiscall
duckdb::DatePart::EpochOperator::Operation<duckdb::interval_t,double>
          (EpochOperator *this,interval_t input)

{
  ulong uVar1;
  
  uVar1 = (ulong)(uint)((int)this >> 0x1f) << 0x20 | (ulong)this & 0xffffffff;
  return (double)input._0_8_ / 1000000.0 +
         (double)((((long)this >> 0x20) + (long)((int)((long)uVar1 % 0xc) * 0x1e)) * 0x15180 +
                 (long)(int)((long)uVar1 / 0xc) * 0x1e187e0);
}

Assistant:

double DatePart::EpochOperator::Operation(interval_t input) {
	int64_t interval_years = input.months / Interval::MONTHS_PER_YEAR;
	int64_t interval_days;
	interval_days = Interval::DAYS_PER_YEAR * interval_years;
	interval_days += Interval::DAYS_PER_MONTH * (input.months % Interval::MONTHS_PER_YEAR);
	interval_days += input.days;
	int64_t interval_epoch;
	interval_epoch = interval_days * Interval::SECS_PER_DAY;
	// we add 0.25 days per year to sort of account for leap days
	interval_epoch += interval_years * (Interval::SECS_PER_DAY / 4);
	return double(interval_epoch) + double(input.micros) / double(Interval::MICROS_PER_SEC);
}